

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O3

Value * __thiscall
camp::ArrayProperty::get
          (Value *__return_storage_ptr__,ArrayProperty *this,UserObject *object,size_t index)

{
  bool bVar1;
  size_t size;
  ForbiddenRead *__return_storage_ptr___00;
  string *propertyName;
  OutOfRange *__return_storage_ptr___01;
  string local_100;
  string local_e0;
  OutOfRange local_c0;
  ForbiddenRead local_78;
  
  bVar1 = Property::readable(&this->super_Property,object);
  if (!bVar1) {
    __return_storage_ptr___00 = (ForbiddenRead *)__cxa_allocate_exception(0x48);
    propertyName = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenRead::ForbiddenRead(&local_78,propertyName);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,"");
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,
               "Value camp::ArrayProperty::get(const UserObject &, std::size_t) const","");
    Error::prepare<camp::ForbiddenRead>
              (__return_storage_ptr___00,&local_78,&local_100,0x5c,&local_e0);
    __cxa_throw(__return_storage_ptr___00,&ForbiddenRead::typeinfo,Error::~Error);
  }
  size = ArrayProperty::size(this,object);
  if (index < size) {
    (*(this->super_Property).super_TagHolder._vptr_TagHolder[9])
              (__return_storage_ptr__,this,object,index);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___01 = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange(&local_c0,index,size);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
             ,"");
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "Value camp::ArrayProperty::get(const UserObject &, std::size_t) const","");
  Error::prepare<camp::OutOfRange>(__return_storage_ptr___01,&local_c0,&local_100,0x61,&local_e0);
  __cxa_throw(__return_storage_ptr___01,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

Value ArrayProperty::get(const UserObject& object, std::size_t index) const
{
    // Check if the property is readable
    if (!readable(object))
        CAMP_ERROR(ForbiddenRead(name()));

    // Make sure that the index is not out of range
    std::size_t range = size(object);
    if (index >= range)
        CAMP_ERROR(OutOfRange(index, range));

    return getElement(object, index);
}